

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__process_scan_header(stbi__jpeg *z)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int aa;
  int q;
  int which;
  int id;
  int Ls;
  int i;
  stbi__jpeg *z_local;
  
  iVar3 = stbi__get16be(z->s);
  bVar1 = stbi__get8(z->s);
  z->scan_n = (uint)bVar1;
  if (((z->scan_n < 1) || (4 < z->scan_n)) || (z->s->img_n < z->scan_n)) {
    z_local._4_4_ = stbi__err("bad SOS component count");
  }
  else if (iVar3 == z->scan_n * 2 + 6) {
    for (id = 0; id < z->scan_n; id = id + 1) {
      bVar1 = stbi__get8(z->s);
      bVar2 = stbi__get8(z->s);
      aa = 0;
      while ((aa < z->s->img_n && (z->img_comp[aa].id != (uint)bVar1))) {
        aa = aa + 1;
      }
      if (aa == z->s->img_n) {
        return 0;
      }
      z->img_comp[aa].hd = (int)(uint)bVar2 >> 4;
      if (3 < z->img_comp[aa].hd) {
        iVar3 = stbi__err("bad DC huff");
        return iVar3;
      }
      z->img_comp[aa].ha = bVar2 & 0xf;
      if (3 < z->img_comp[aa].ha) {
        iVar3 = stbi__err("bad AC huff");
        return iVar3;
      }
      z->order[id] = aa;
    }
    bVar1 = stbi__get8(z->s);
    z->spec_start = (uint)bVar1;
    bVar1 = stbi__get8(z->s);
    z->spec_end = (uint)bVar1;
    bVar1 = stbi__get8(z->s);
    z->succ_high = (int)(uint)bVar1 >> 4;
    z->succ_low = bVar1 & 0xf;
    if (z->progressive == 0) {
      if (z->spec_start != 0) {
        iVar3 = stbi__err("bad SOS");
        return iVar3;
      }
      if ((z->succ_high != 0) || (z->succ_low != 0)) {
        iVar3 = stbi__err("bad SOS");
        return iVar3;
      }
      z->spec_end = 0x3f;
    }
    else if ((((0x3f < z->spec_start) || (0x3f < z->spec_end)) || (z->spec_end < z->spec_start)) ||
            ((0xd < z->succ_high || (0xd < z->succ_low)))) {
      iVar3 = stbi__err("bad SOS");
      return iVar3;
    }
    z_local._4_4_ = 1;
  }
  else {
    z_local._4_4_ = stbi__err("bad SOS len");
  }
  return z_local._4_4_;
}

Assistant:

static int stbi__process_scan_header(stbi__jpeg *z)
{
   int i;
   int Ls = stbi__get16be(z->s);
   z->scan_n = stbi__get8(z->s);
   if (z->scan_n < 1 || z->scan_n > 4 || z->scan_n > (int) z->s->img_n) return stbi__err("bad SOS component count","Corrupt JPEG");
   if (Ls != 6+2*z->scan_n) return stbi__err("bad SOS len","Corrupt JPEG");
   for (i=0; i < z->scan_n; ++i) {
      int id = stbi__get8(z->s), which;
      int q = stbi__get8(z->s);
      for (which = 0; which < z->s->img_n; ++which)
         if (z->img_comp[which].id == id)
            break;
      if (which == z->s->img_n) return 0; // no match
      z->img_comp[which].hd = q >> 4;   if (z->img_comp[which].hd > 3) return stbi__err("bad DC huff","Corrupt JPEG");
      z->img_comp[which].ha = q & 15;   if (z->img_comp[which].ha > 3) return stbi__err("bad AC huff","Corrupt JPEG");
      z->order[i] = which;
   }

   {
      int aa;
      z->spec_start = stbi__get8(z->s);
      z->spec_end   = stbi__get8(z->s); // should be 63, but might be 0
      aa = stbi__get8(z->s);
      z->succ_high = (aa >> 4);
      z->succ_low  = (aa & 15);
      if (z->progressive) {
         if (z->spec_start > 63 || z->spec_end > 63  || z->spec_start > z->spec_end || z->succ_high > 13 || z->succ_low > 13)
            return stbi__err("bad SOS", "Corrupt JPEG");
      } else {
         if (z->spec_start != 0) return stbi__err("bad SOS","Corrupt JPEG");
         if (z->succ_high != 0 || z->succ_low != 0) return stbi__err("bad SOS","Corrupt JPEG");
         z->spec_end = 63;
      }
   }

   return 1;
}